

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::Error(string *m)

{
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  std::operator+(&bStack_28,"CMake Error: ",m);
  s_ErrorOccurred = true;
  Message(&bStack_28,"Error");
  std::__cxx11::string::~string((string *)&bStack_28);
  return;
}

Assistant:

void cmSystemTools::Error(const std::string& m)
{
  std::string message = "CMake Error: " + m;
  cmSystemTools::s_ErrorOccurred = true;
  cmSystemTools::Message(message, "Error");
}